

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::JunitReporter::writeGroup(JunitReporter *this,TestGroupNode *groupNode,double suiteTime)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  element_type *peVar4;
  string *str;
  string *text;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>
  *child;
  const_iterator __end1;
  const_iterator __begin1;
  ChildNodes *__range1;
  ScopedElement properties;
  TestGroupStats *stats;
  ScopedElement e;
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
  *in_stack_fffffffffffffab8;
  undefined4 in_stack_fffffffffffffac0;
  XmlFormatting in_stack_fffffffffffffac4;
  string *in_stack_fffffffffffffac8;
  ScopedElement *in_stack_fffffffffffffad0;
  ScopedElement *this_00;
  undefined8 in_stack_fffffffffffffad8;
  XmlFormatting fmt;
  string *in_stack_fffffffffffffae0;
  string *name;
  undefined4 in_stack_fffffffffffffae8;
  int in_stack_fffffffffffffaec;
  string *in_stack_fffffffffffffaf0;
  allocator *paVar5;
  string *in_stack_fffffffffffffaf8;
  TestCaseNode *in_stack_fffffffffffffb00;
  JunitReporter *in_stack_fffffffffffffb08;
  string *in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb1c;
  ScopedElement local_3e9;
  undefined1 local_3d1 [33];
  __normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>_>
  local_3b0;
  long local_3a8;
  int local_3a0;
  allocator local_39b;
  undefined1 local_39a [23];
  allocator local_383;
  allocator local_382;
  allocator local_381 [24];
  allocator local_369 [21];
  allocator local_354;
  allocator local_353;
  allocator local_352;
  allocator local_351;
  size_t local_350;
  allocator local_341;
  long local_340;
  allocator local_333;
  allocator local_332;
  allocator local_331;
  long local_330;
  allocator local_311 [25];
  long local_2f8;
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  string local_28 [32];
  long local_8;
  
  fmt = (XmlFormatting)((ulong)in_stack_fffffffffffffad8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_2f8 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"testsuite",local_311);
  operator|(Newline,Indent);
  XmlWriter::scopedElement
            ((XmlWriter *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
             in_stack_fffffffffffffae0,fmt);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)local_311);
  local_330 = local_2f8 + 8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"name",&local_331);
  XmlWriter::writeAttribute
            ((XmlWriter *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
             in_stack_fffffffffffffaf0);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"errors",&local_332);
  XmlWriter::writeAttribute<unsigned_int>
            ((XmlWriter *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
             in_stack_fffffffffffffb10,(uint *)in_stack_fffffffffffffb08);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_332);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"failures",&local_333);
  local_340 = *(long *)(local_330 + 0x48) - (ulong)*(uint *)(in_RDI + 0x168);
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
             in_stack_fffffffffffffb10,(unsigned_long *)in_stack_fffffffffffffb08);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_333);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"tests",&local_341);
  local_350 = Counts::total((Counts *)(local_330 + 0x40));
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
             in_stack_fffffffffffffb10,(unsigned_long *)in_stack_fffffffffffffb08);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"hostname",&local_351);
  XmlWriter::writeAttribute<char[4]>
            ((XmlWriter *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
             in_stack_fffffffffffffb10,(char (*) [4])in_stack_fffffffffffffb08);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  peVar4 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x251063);
  iVar2 = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[0xb])();
  if (iVar2 == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"time",&local_352);
    XmlWriter::writeAttribute<char[1]>
              ((XmlWriter *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
               in_stack_fffffffffffffb10,(char (*) [1])in_stack_fffffffffffffb08);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_352);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"time",&local_353);
    (anonymous_namespace)::formatDuration_abi_cxx11_((double)in_stack_fffffffffffffb08);
    XmlWriter::writeAttribute
              ((XmlWriter *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
               in_stack_fffffffffffffaf0);
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_353);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,"timestamp",&local_354);
  (anonymous_namespace)::getCurrentTimestamp_abi_cxx11_();
  XmlWriter::writeAttribute
            ((XmlWriter *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
             in_stack_fffffffffffffaf0);
  std::__cxx11::string::~string(local_168);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_354);
  peVar4 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2514ea);
  uVar3 = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[0xe])();
  if ((uVar3 & 1) == 0) {
    peVar4 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x25151d);
    iVar2 = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[0x11])();
    if (iVar2 == 0) goto LAB_00251c77;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"properties",local_369);
  operator|(Newline,Indent);
  XmlWriter::scopedElement
            ((XmlWriter *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
             in_stack_fffffffffffffae0,fmt);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)local_369);
  peVar4 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2515e9);
  uVar3 = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[0xe])();
  if ((uVar3 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a8,"property",local_381);
    operator|(Newline,Indent);
    XmlWriter::scopedElement
              ((XmlWriter *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
               in_stack_fffffffffffffae0,fmt);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c8,"name",&local_382);
    XmlWriter::ScopedElement::writeAttribute<char[8]>
              (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
               (char (*) [8])CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e8,"value",&local_383);
    peVar4 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x25171b);
    (*(peVar4->super_NonCopyable)._vptr_NonCopyable[0xf])();
    serializeFilters((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    XmlWriter::ScopedElement::writeAttribute<std::__cxx11::string>
              (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
    std::__cxx11::string::~string(local_208);
    std::__cxx11::string::~string(local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_383);
    std::__cxx11::string::~string(local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_382);
    XmlWriter::ScopedElement::~ScopedElement
              ((ScopedElement *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
    std::__cxx11::string::~string(local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)local_381);
  }
  peVar4 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2519b8);
  iVar2 = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[0x11])();
  if (iVar2 != 0) {
    in_stack_fffffffffffffb08 = (JunitReporter *)(in_RDI + 0xd8);
    paVar5 = (allocator *)(local_39a + 1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_228,"property",paVar5);
    operator|(Newline,Indent);
    XmlWriter::scopedElement
              ((XmlWriter *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
               in_stack_fffffffffffffae0,fmt);
    in_stack_fffffffffffffb00 = (TestCaseNode *)local_39a;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_248,"name",(allocator *)in_stack_fffffffffffffb00);
    XmlWriter::ScopedElement::writeAttribute<char[12]>
              (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
               (char (*) [12])CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
    paVar5 = &local_39b;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_268,"value",paVar5);
    peVar4 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x251ad5);
    in_stack_fffffffffffffaec = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[0x11])();
    local_3a0 = in_stack_fffffffffffffaec;
    XmlWriter::ScopedElement::writeAttribute<unsigned_int>
              (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
               (uint *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
    std::__cxx11::string::~string(local_268);
    std::allocator<char>::~allocator((allocator<char> *)&local_39b);
    std::__cxx11::string::~string(local_248);
    std::allocator<char>::~allocator((allocator<char> *)local_39a);
    XmlWriter::ScopedElement::~ScopedElement
              ((ScopedElement *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
    std::__cxx11::string::~string(local_228);
    std::allocator<char>::~allocator((allocator<char> *)(local_39a + 1));
  }
  XmlWriter::ScopedElement::~ScopedElement
            ((ScopedElement *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
LAB_00251c77:
  local_3a8 = local_2f8 + 0x80;
  local_3b0._M_current =
       (shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>
        *)clara::std::
          vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
          ::begin(in_stack_fffffffffffffab8);
  local_3d1._25_8_ =
       clara::std::
       vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
       ::end(in_stack_fffffffffffffab8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                            (__normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>_>
                             *)in_stack_fffffffffffffab8), bVar1) {
    local_3d1._17_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>_>
         ::operator*(&local_3b0);
    clara::std::
    __shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator*((__shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
    writeTestCase(in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>_>
    ::operator++(&local_3b0);
  }
  str = (string *)(in_RDI + 0xd8);
  name = (string *)local_3d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_288,"system-out",(allocator *)name);
  operator|(Newline,Indent);
  XmlWriter::scopedElement
            ((XmlWriter *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),name,
             (XmlFormatting)((ulong)str >> 0x20));
  trim(str);
  XmlWriter::ScopedElement::writeText
            (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac4);
  std::__cxx11::string::~string(local_2a8);
  XmlWriter::ScopedElement::~ScopedElement
            ((ScopedElement *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator((allocator<char> *)local_3d1);
  text = (string *)(in_RDI + 0xd8);
  this_00 = &local_3e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c8,"system-err",(allocator *)this_00);
  operator|(Newline,Indent);
  XmlWriter::scopedElement
            ((XmlWriter *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),name,
             (XmlFormatting)((ulong)str >> 0x20));
  trim(str);
  XmlWriter::ScopedElement::writeText(this_00,text,in_stack_fffffffffffffac4);
  std::__cxx11::string::~string(local_2e8);
  XmlWriter::ScopedElement::~ScopedElement
            ((ScopedElement *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  XmlWriter::ScopedElement::~ScopedElement
            ((ScopedElement *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void JunitReporter::writeGroup( TestGroupNode const& groupNode, double suiteTime ) {
        XmlWriter::ScopedElement e = xml.scopedElement( "testsuite" );

        TestGroupStats const& stats = groupNode.value;
        xml.writeAttribute( "name", stats.groupInfo.name );
        xml.writeAttribute( "errors", unexpectedExceptions );
        xml.writeAttribute( "failures", stats.totals.assertions.failed-unexpectedExceptions );
        xml.writeAttribute( "tests", stats.totals.assertions.total() );
        xml.writeAttribute( "hostname", "tbd" ); // !TBD
        if( m_config->showDurations() == ShowDurations::Never )
            xml.writeAttribute( "time", "" );
        else
            xml.writeAttribute( "time", formatDuration( suiteTime ) );
        xml.writeAttribute( "timestamp", getCurrentTimestamp() );

        // Write properties if there are any
        if (m_config->hasTestFilters() || m_config->rngSeed() != 0) {
            auto properties = xml.scopedElement("properties");
            if (m_config->hasTestFilters()) {
                xml.scopedElement("property")
                    .writeAttribute("name", "filters")
                    .writeAttribute("value", serializeFilters(m_config->getTestsOrTags()));
            }
            if (m_config->rngSeed() != 0) {
                xml.scopedElement("property")
                    .writeAttribute("name", "random-seed")
                    .writeAttribute("value", m_config->rngSeed());
            }
        }

        // Write test cases
        for( auto const& child : groupNode.children )
            writeTestCase( *child );

        xml.scopedElement( "system-out" ).writeText( trim( stdOutForSuite ), XmlFormatting::Newline );
        xml.scopedElement( "system-err" ).writeText( trim( stdErrForSuite ), XmlFormatting::Newline );
    }